

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O2

void GC::Mark(DObject **obj)

{
  uint uVar1;
  DObject *pDVar2;
  
  pDVar2 = *obj;
  if (pDVar2 != (DObject *)0x0) {
    uVar1 = pDVar2->ObjectFlags;
    if ((uVar1 & 0x20) != 0) {
      *obj = (DObject *)0x0;
      return;
    }
    if ((uVar1 & 3) != 0) {
      pDVar2->ObjectFlags = uVar1 & 0xffffffdc;
      pDVar2->GCNext = Gray;
      Gray = pDVar2;
    }
  }
  return;
}

Assistant:

void Mark(DObject **obj)
{
	DObject *lobj = *obj;
	if (lobj != NULL)
	{
		if (lobj->ObjectFlags & OF_EuthanizeMe)
		{
			*obj = (DObject *)NULL;
		}
		else if (lobj->IsWhite())
		{
			lobj->White2Gray();
			lobj->GCNext = Gray;
			Gray = lobj;
		}
	}
}